

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpGCTest_Collect_TableCycle_Test::TestBody(InterpGCTest_Collect_TableCycle_Test *this)

{
  Limits limits;
  bool bVar1;
  Table *pTVar2;
  Table *pTVar3;
  Ref RVar4;
  char *pcVar5;
  AssertHelper local_1d0;
  Message local_1c8;
  Index local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_1;
  Message local_1a0;
  unsigned_long local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar;
  Index after_new;
  TableType local_138;
  undefined1 local_108 [8];
  Ptr t3;
  undefined1 local_c0 [8];
  Ptr t2;
  undefined1 local_78 [8];
  Ptr t1;
  undefined8 local_58;
  undefined8 local_50;
  ValueType local_48;
  undefined1 local_40 [8];
  TableType tt;
  InterpGCTest_Collect_TableCycle_Test *this_local;
  
  tt.limits._16_8_ = this;
  wabt::Type::Type(&local_48,ExternRef);
  wabt::Limits::Limits((Limits *)&t1.root_index_,2);
  limits.max = local_58;
  limits.initial = t1.root_index_;
  limits._16_8_ = local_50;
  wabt::interp::TableType::TableType((TableType *)local_40,local_48,limits);
  wabt::interp::TableType::TableType((TableType *)&t2.root_index_,(TableType *)local_40);
  wabt::interp::Table::New
            ((Ptr *)local_78,&(this->super_InterpGCTest).super_InterpTest.store_,
             (TableType *)&t2.root_index_);
  wabt::interp::TableType::~TableType((TableType *)&t2.root_index_);
  wabt::interp::TableType::TableType((TableType *)&t3.root_index_,(TableType *)local_40);
  wabt::interp::Table::New
            ((Ptr *)local_c0,&(this->super_InterpGCTest).super_InterpTest.store_,
             (TableType *)&t3.root_index_);
  wabt::interp::TableType::~TableType((TableType *)&t3.root_index_);
  wabt::interp::TableType::TableType(&local_138,(TableType *)local_40);
  wabt::interp::Table::New
            ((Ptr *)local_108,&(this->super_InterpGCTest).super_InterpTest.store_,&local_138);
  wabt::interp::TableType::~TableType(&local_138);
  pTVar2 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_78);
  pTVar3 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_78);
  RVar4 = wabt::interp::Object::self((Object *)pTVar3);
  wabt::interp::Table::Set(pTVar2,&(this->super_InterpGCTest).super_InterpTest.store_,0,RVar4);
  pTVar2 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_c0);
  pTVar3 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_108);
  RVar4 = wabt::interp::Object::self((Object *)pTVar3);
  wabt::interp::Table::Set(pTVar2,&(this->super_InterpGCTest).super_InterpTest.store_,0,RVar4);
  pTVar2 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_108);
  pTVar3 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_c0);
  RVar4 = wabt::interp::Object::self((Object *)pTVar3);
  wabt::interp::Table::Set(pTVar2,&(this->super_InterpGCTest).super_InterpTest.store_,0,RVar4);
  pTVar2 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_108);
  pTVar3 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_78);
  RVar4 = wabt::interp::Object::self((Object *)pTVar3);
  wabt::interp::Table::Set(pTVar2,&(this->super_InterpGCTest).super_InterpTest.store_,1,RVar4);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )wabt::interp::Store::object_count(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_198 = (this->super_InterpGCTest).before_new + 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_190,"before_new + 3","after_new",&local_198,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x26d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  wabt::interp::RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)local_78);
  wabt::interp::RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)local_c0);
  wabt::interp::Store::Collect(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_1c0 = wabt::interp::Store::object_count(&(this->super_InterpGCTest).super_InterpTest.store_)
  ;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1b8,"after_new","store_.object_count()",
             (unsigned_long *)&gtest_ar.message_,&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x273,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  wabt::interp::RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)local_108);
  wabt::interp::RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_108);
  wabt::interp::RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_c0);
  wabt::interp::RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_78);
  wabt::interp::TableType::~TableType((TableType *)local_40);
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_TableCycle) {
  auto tt = TableType{ValueType::ExternRef, Limits{2}};
  auto t1 = Table::New(store_, tt);
  auto t2 = Table::New(store_, tt);
  auto t3 = Table::New(store_, tt);

  t1->Set(store_, 0, t1->self());  // t1 references itself.
  t2->Set(store_, 0, t3->self());
  t3->Set(store_, 0, t2->self());  // t2 and t3 reference each other.
  t3->Set(store_, 1, t1->self());  // t3 also references t1.

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 3, after_new);

  // Remove t1 and t2 roots, but their kept alive by t3.
  t1.reset();
  t2.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove t3 root, now all should be removed.
  t3.reset();
}